

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O0

void anon_unknown.dwarf_1012a6::SetMapValue(t_StringToString *map,string *op,char *value)

{
  mapped_type *this;
  char *value_local;
  string *op_local;
  t_StringToString *map_local;
  
  if (value == (char *)0x0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase(map,op);
  }
  else {
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](map,op);
    std::__cxx11::string::operator=((string *)this,value);
  }
  return;
}

Assistant:

void SetMapValue(cmCTestGenericHandler::t_StringToString& map,
                 const std::string& op, const char* value)
{
  if (!value) {
    map.erase(op);
    return;
  }

  map[op] = value;
}